

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNVarInRange::gen_forstm_reinit(CTPNVarInRange *this)

{
  long in_RDI;
  int unaff_retaddr;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    CTPNPreInc_gen_code((CTcPrsNode *)this,in_stack_0000000c);
  }
  else {
    CTPNAddAsi_gen_code((CTcPrsNode *)this,
                        (CTcPrsNode *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr);
  }
  return;
}

Assistant:

void CTPNVarInRange::gen_forstm_reinit()
{
    /* 
     *   If we have a step expression, generate "lval += step".  Otherwise
     *   just generate "++lval".  
     */
    if (step_expr_ != 0)
    {
        /* generate "lval += step" */
        CTPNAddAsi_gen_code(lval_, step_expr_, TRUE);
    }
    else
    {
        /* increment the control variable */
        CTPNPreInc_gen_code(lval_, TRUE);
    }
}